

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

void __thiscall icu_63::UVector::setElementAt(UVector *this,int32_t elem,int32_t index)

{
  UElement *pUVar1;
  
  if ((-1 < index) && (index < this->count)) {
    pUVar1 = this->elements;
    if ((pUVar1[(uint)index].pointer != (void *)0x0) && (this->deleter != (UObjectDeleter *)0x0)) {
      (*this->deleter)(pUVar1[(uint)index].pointer);
      pUVar1 = this->elements;
    }
    pUVar1[(uint)index].pointer = (void *)0x0;
    this->elements[(uint)index].integer = elem;
  }
  return;
}

Assistant:

void UVector::setElementAt(int32_t elem, int32_t index) {
    if (0 <= index && index < count) {
        if (elements[index].pointer != 0 && deleter != 0) {
            // TODO:  this should be an error.  mixing up ints and pointers.
            (*deleter)(elements[index].pointer);
        }
        elements[index].pointer = NULL;
        elements[index].integer = elem;
    }
    /* else index out of range */
}